

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O0

iterator __thiscall
QHash<QWidget*,QRect>::emplace<QRect_const&>
          (QHash<QWidget_*,_QRect> *this,QWidget **key,QRect *args)

{
  long lVar1;
  bool bVar2;
  QHash<QWidget_*,_QRect> *in_RDX;
  QWidget **in_RDI;
  long in_FS_OFFSET;
  iterator iVar3;
  QHash<QWidget_*,_QRect> copy;
  QHash<QWidget_*,_QRect> *in_stack_ffffffffffffff98;
  QHash<QWidget_*,_QRect> *in_stack_ffffffffffffffa0;
  QRect *in_stack_ffffffffffffffa8;
  undefined1 local_30 [16];
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = QHash<QWidget_*,_QRect>::isDetached(in_stack_ffffffffffffffa0);
  if (bVar2) {
    bVar2 = QHashPrivate::Data<QHashPrivate::Node<QWidget_*,_QRect>_>::shouldGrow
                      ((Data<QHashPrivate::Node<QWidget_*,_QRect>_> *)*in_RDI);
    if (bVar2) {
      local_30 = (undefined1  [16])
                 QHash<QWidget_*,_QRect>::emplace_helper<QRect>
                           (in_RDX,in_RDI,in_stack_ffffffffffffffa8);
    }
    else {
      local_30 = (undefined1  [16])
                 emplace_helper<QRect_const&>(in_RDX,in_RDI,in_stack_ffffffffffffffa8);
    }
  }
  else {
    QHash<QWidget_*,_QRect>::QHash(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    QHash<QWidget_*,_QRect>::detach(in_stack_ffffffffffffffa0);
    local_30 = (undefined1  [16])
               emplace_helper<QRect_const&>(in_RDX,in_RDI,in_stack_ffffffffffffffa8);
    QHash<QWidget_*,_QRect>::~QHash(in_stack_ffffffffffffffa0);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    iVar3.i.d = (Data<QHashPrivate::Node<QWidget_*,_QRect>_> *)local_30._0_8_;
    iVar3.i.bucket = local_30._8_8_;
    return (iterator)iVar3.i;
  }
  __stack_chk_fail();
}

Assistant:

iterator emplace(Key &&key, Args &&... args)
    {
        if (isDetached()) {
            if (d->shouldGrow()) // Construct the value now so that no dangling references are used
                return emplace_helper(std::move(key), T(std::forward<Args>(args)...));
            return emplace_helper(std::move(key), std::forward<Args>(args)...);
        }
        // else: we must detach
        const auto copy = *this; // keep 'args' alive across the detach/growth
        detach();
        return emplace_helper(std::move(key), std::forward<Args>(args)...);
    }